

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileTests.cpp
# Opt level: O3

void __thiscall
solitaire::piles::TableauPileInitializationTest_isSnapshotOfSameObject_Test::
TableauPileInitializationTest_isSnapshotOfSameObject_Test
          (TableauPileInitializationTest_isSnapshotOfSameObject_Test *this)

{
  initializer_list<solitaire::cards::Card> __l;
  allocator_type local_21;
  Card local_20;
  Card local_18;
  
  TableauPileWithUncoveredTopTwoCardsTest::TableauPileWithUncoveredTopTwoCardsTest
            ((TableauPileWithUncoveredTopTwoCardsTest *)this);
  (this->super_TableauPileInitializationTest).super_TableauPileWithUncoveredTopTwoCardsTest.
  super_InitializedTableauPileTest.super_EmptyTableauPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__TableauPileInitializationTest_0032ca68;
  solitaire::cards::Card::Card(&local_20,Six,Club);
  solitaire::cards::Card::Card(&local_18,Ten,Spade);
  __l._M_len = 2;
  __l._M_array = &local_20;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&(this->super_TableauPileInitializationTest).newPileCards,__l,&local_21);
  (this->super_TableauPileInitializationTest).super_TableauPileWithUncoveredTopTwoCardsTest.
  super_InitializedTableauPileTest.super_EmptyTableauPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__TableauPileInitializationTest_0032c380;
  return;
}

Assistant:

TEST_F(TableauPileInitializationTest, isSnapshotOfSameObject) {
    const auto snapshot = pile->createSnapshot();
    initializePile(*pile, newPileCards);
    const auto snapshotOfSameObject = pile->createSnapshot();
    const auto snapshotOfSameTypeObject = std::make_shared<TableauPile>()->createSnapshot();
    SnapshotMock snapshotOfDifferentTypeObject;

    EXPECT_TRUE(snapshot->isSnapshotOfSameObject(*snapshotOfSameObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(*snapshotOfSameTypeObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(snapshotOfDifferentTypeObject));
}